

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::ta::system_t::set_guards
          (system_t *this,edge_id_t id,
          range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
          *guards)

{
  bool bVar1;
  expression_type_t type;
  integer_variables_t *piVar2;
  clock_variables_t *pcVar3;
  element_type *peVar4;
  invalid_argument *this_00;
  element_type *expr;
  element_type *peVar5;
  bytecode_t *pbVar6;
  reference this_01;
  stringstream oss;
  exception *e;
  shared_ptr<long> sStack_1e0;
  undefined1 local_1c8 [8];
  shared_ptr<long> guard_bytecode;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b0;
  undefined1 local_190 [8];
  shared_ptr<tchecker::typed_expression_t> guard_typed_expr;
  undefined1 local_d0 [8];
  shared_ptr<tchecker::expression_t> guard_expr;
  integer_variables_t localvars;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  *guards_local;
  edge_id_t id_local;
  system_t *this_local;
  
  integer_variables_t::integer_variables_t
            ((integer_variables_t *)
             &guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  piVar2 = tchecker::system::intvars_t::integer_variables
                     (&(this->super_system_t).super_system_t.super_intvars_t);
  pcVar3 = tchecker::system::clocks_t::clock_variables((clocks_t *)this);
  clock_variables_t::clock_variables_t
            ((clock_variables_t *)
             &guard_typed_expr.
              super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pcVar3);
  conjunction_from_attributes
            ((ta *)local_d0,guards,
             (integer_variables_t *)
             &guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,piVar2,
             (clock_variables_t *)
             &guard_typed_expr.
              super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  clock_variables_t::~clock_variables_t
            ((clock_variables_t *)
             &guard_typed_expr.
              super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar4 = std::__shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
  if (peVar4 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Syntax error");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  expr = std::__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_d0);
  piVar2 = tchecker::system::intvars_t::integer_variables
                     (&(this->super_system_t).super_system_t.super_intvars_t);
  pcVar3 = tchecker::system::clocks_t::clock_variables((clocks_t *)this);
  std::function<void(std::__cxx11::string_const&)>::function<tchecker::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1b0,
             (anon_class_1_0_00000001 *)
             ((long)&guard_bytecode.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  typecheck((tchecker *)local_190,expr,
            (integer_variables_t *)
            &guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount,piVar2,pcVar3,&local_1b0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b0);
  peVar5 = std::
           __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_190);
  type = typed_expression_t::type(peVar5);
  bVar1 = bool_valued(type);
  if (!bVar1) {
    __assert_fail("tchecker::bool_valued(guard_typed_expr->type())",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                  ,0xe6,
                  "void tchecker::ta::system_t::set_guards(tchecker::edge_id_t, const tchecker::range_t<tchecker::system::attributes_t::const_iterator_t> &)"
                 );
  }
  peVar5 = std::
           __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_190);
  pbVar6 = compile(peVar5);
  std::shared_ptr<long>::shared_ptr<long,std::default_delete<long[]>,void>
            ((shared_ptr<long> *)local_1c8,pbVar6);
  std::shared_ptr<tchecker::typed_expression_t>::shared_ptr
            ((shared_ptr<tchecker::typed_expression_t> *)&e,
             (shared_ptr<tchecker::typed_expression_t> *)local_190);
  std::shared_ptr<long>::shared_ptr(&sStack_1e0,(shared_ptr<long> *)local_1c8);
  this_01 = std::
            vector<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
            ::operator[](&this->_guards,(ulong)id);
  compiled_expression_t::operator=(this_01,(compiled_expression_t *)&e);
  compiled_expression_t::~compiled_expression_t((compiled_expression_t *)&e);
  std::shared_ptr<long>::~shared_ptr((shared_ptr<long> *)local_1c8);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<tchecker::typed_expression_t> *)local_190);
  std::shared_ptr<tchecker::expression_t>::~shared_ptr
            ((shared_ptr<tchecker::expression_t> *)local_d0);
  integer_variables_t::~integer_variables_t
            ((integer_variables_t *)
             &guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void system_t::set_guards(tchecker::edge_id_t id,
                          tchecker::range_t<tchecker::system::attributes_t::const_iterator_t> const & guards)
{
  tchecker::integer_variables_t localvars;

  std::shared_ptr<tchecker::expression_t> guard_expr{
      conjunction_from_attributes(guards, localvars, integer_variables(), clock_variables())};
  if (guard_expr.get() == nullptr)
    throw std::invalid_argument("Syntax error");

  std::shared_ptr<tchecker::typed_expression_t> guard_typed_expr{
      tchecker::typecheck(*guard_expr, localvars, integer_variables(), clock_variables())};
  assert(tchecker::bool_valued(guard_typed_expr->type()));

  try {
    std::shared_ptr<tchecker::bytecode_t> guard_bytecode{tchecker::compile(*guard_typed_expr),
                                                         std::default_delete<tchecker::bytecode_t[]>()};
    _guards[id] = {guard_typed_expr, guard_bytecode};
  }
  catch (std::exception const & e) {
    std::stringstream oss;
    oss << e.what();
    throw std::invalid_argument(oss.str());
  }
}